

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.c
# Opt level: O2

cio_error cio_init_uds_socket_address(cio_socket_address *sock_address,char *path)

{
  size_t sVar1;
  cio_error cVar2;
  
  cVar2 = CIO_INVALID_ARGUMENT;
  if ((sock_address != (cio_socket_address *)0x0) && (path != (char *)0x0)) {
    sVar1 = strlen(path + (*path == '\0'));
    if (sVar1 + 1 < 0x6d) {
      *(undefined8 *)&(sock_address->impl).sa = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 8) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x5e) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x66) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x50) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x58) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x40) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x48) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x30) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x38) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x20) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x28) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x10) = 0;
      *(undefined8 *)((long)&(sock_address->impl).sa + 0x18) = 0;
      (sock_address->impl).sa.socket_address.addr.sa_family = 1;
      memcpy((void *)((long)&(sock_address->impl).sa + 2),path,sVar1 + 1);
      (sock_address->impl).len = (int)sVar1 + 3;
      cVar2 = CIO_SUCCESS;
    }
  }
  return cVar2;
}

Assistant:

cio_error cio_init_uds_socket_address(struct cio_socket_address *sock_address, const char *path)
{
	if (cio_unlikely((sock_address == NULL) || (path == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	size_t max_path_length = sizeof(sock_address->impl.sa.unix_address.un.sun_path);
	size_t path_length = 0;
	if (is_abstract_uds(path)) {
		path_length = strlen(path + 1) + 1;
	} else {
		path_length = strlen(path) + 1;
	}

	if (cio_unlikely(path_length > max_path_length)) {
		return CIO_INVALID_ARGUMENT;
	}

	memset(&sock_address->impl.sa.unix_address.un, 0x0, sizeof(sock_address->impl.sa.unix_address.un));
	sock_address->impl.sa.socket_address.addr.sa_family = (sa_family_t)CIO_ADDRESS_FAMILY_UNIX;
	memcpy(sock_address->impl.sa.unix_address.un.sun_path, path, path_length);
	sock_address->impl.len = (socklen_t)(offsetof(struct sockaddr_un, sun_path) + path_length);

	return CIO_SUCCESS;
}